

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

char * lyd_path_set(ly_set *dnodes,LYD_PATH_TYPE pathtype)

{
  lyd_node *node;
  size_t sVar1;
  LY_ERR LVar2;
  int iVar3;
  lys_module *plVar4;
  lysc_node *plVar5;
  lys_module *plVar6;
  size_t sVar7;
  lysc_node **pplVar8;
  char *pcVar9;
  lys_module *plVar10;
  char *pcVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  lyd_node *node_00;
  long lVar15;
  bool bVar16;
  char *buffer;
  size_t bufused;
  size_t buflen;
  LYD_PATH_TYPE local_44;
  ly_set *local_40;
  ulong local_38;
  
  bufused = 0;
  buflen = 0;
  buffer = (char *)0x0;
  if (pathtype < 2) {
    uVar14 = 0xffffffffffffffff;
    local_44 = pathtype;
    local_40 = dnodes;
LAB_00121f79:
    do {
      do {
        uVar12 = (int)uVar14 + 2;
        if (dnodes->count < uVar12) {
          return buffer;
        }
        uVar13 = (ulong)((int)uVar14 + 1);
        node = (dnodes->field_2).dnodes[uVar13];
        plVar4 = lyd_node_module(node);
        if ((uVar12 < 2) ||
           (node_00 = (dnodes->field_2).dnodes[uVar14 & 0xffffffff], node_00 == (lyd_node *)0x0)) {
          node_00 = (lyd_node *)0x0;
        }
        else if ((((node->schema != (lysc_node *)0x0) && (node_00->schema != (lysc_node *)0x0)) &&
                 ((node_00->schema->nodetype & 0x60) == 0)) &&
                (plVar5 = lysc_data_node(node->schema->parent), plVar5 != node_00->schema)) {
          if (node->schema == (lysc_node *)0x0) {
            plVar5 = (lysc_node *)0x0;
          }
          else {
            plVar5 = node->schema->parent;
          }
          plVar5 = lysc_data_node(plVar5);
          if (plVar5 == (lysc_node *)0x0) {
            if (node->schema == (lysc_node *)0x0) {
              plVar10 = (lys_module *)&node[2].schema;
            }
            else {
              plVar10 = node->schema->module;
            }
            plVar5 = node_00->schema;
            if (plVar5 == (lysc_node *)0x0) {
              plVar6 = (lys_module *)&node_00[2].schema;
            }
            else {
              plVar6 = plVar5->module;
            }
            if (plVar10->ctx != plVar6->ctx) goto LAB_00121ff2;
          }
          else {
            plVar5 = node_00->schema;
          }
          if ((plVar5->nodetype & 0x700) == 0) {
            __assert_fail("!parent || !iter->schema || !parent->schema || (parent->schema->nodetype & LYD_NODE_ANY) || (lysc_data_parent(iter->schema) == parent->schema) || (!lysc_data_parent(iter->schema) && (LYD_CTX(iter) != LYD_CTX(parent))) || (parent->schema->nodetype & (LYS_RPC | LYS_ACTION | LYS_NOTIF))"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                          ,0xb74,"char *lyd_path_set(const struct ly_set *, LYD_PATH_TYPE)");
          }
        }
LAB_00121ff2:
        local_38 = uVar13;
        plVar6 = lyd_node_module(node_00);
        plVar10 = (lys_module *)0x0;
        if (plVar6 != plVar4) {
          plVar10 = plVar4;
        }
        lVar15 = 1;
        if (plVar10 != (lys_module *)0x0) {
          sVar7 = strlen(plVar10->name);
          lVar15 = sVar7 + 2;
        }
        pplVar8 = (lysc_node **)&node->schema->name;
        if (node->schema == (lysc_node *)0x0) {
          pplVar8 = &node[1].schema;
        }
        sVar7 = strlen((char *)*pplVar8);
        sVar1 = bufused;
        LVar2 = lyd_path_str_enlarge(&buffer,&buflen,lVar15 + bufused + sVar7,'\0');
        dnodes = local_40;
        if (LVar2 != LY_SUCCESS) {
          return buffer;
        }
        pcVar11 = "";
        pcVar9 = "";
        if (plVar10 != (lys_module *)0x0) {
          pcVar11 = plVar10->name;
          pcVar9 = ":";
        }
        bVar16 = local_44 != LYD_PATH_STD;
        iVar3 = sprintf(buffer + sVar1,"/%s%s%s",pcVar11,pcVar9);
        bufused = (long)iVar3 + sVar1;
        uVar14 = local_38;
      } while ((bVar16 && uVar12 < 2) || (plVar5 = node->schema, plVar5 == (lysc_node *)0x0));
      if (plVar5->nodetype == 8) {
        if ((plVar5->flags & 1) == 0) goto LAB_0012210a;
        LVar2 = lyd_path_leaflist_predicate(node,&buffer,&buflen,&bufused,'\0');
      }
      else {
        if (plVar5->nodetype != 0x10) goto LAB_00121f79;
        if ((plVar5->flags & 0x200) == 0) {
          LVar2 = lyd_path_list_predicate(node,&buffer,&buflen,&bufused,'\0');
        }
        else {
LAB_0012210a:
          LVar2 = lyd_path_position_predicate(node,&buffer,&buflen,&bufused,'\0');
        }
      }
      uVar14 = local_38;
    } while (LVar2 == LY_SUCCESS);
  }
  else {
    buffer = (char *)0x0;
  }
  return buffer;
}

Assistant:

char *
lyd_path_set(const struct ly_set *dnodes, LYD_PATH_TYPE pathtype)
{
    uint32_t depth;
    size_t bufused = 0, buflen = 0, len;
    char *buffer = NULL;
    const struct lyd_node *iter, *parent;
    const struct lys_module *mod, *prev_mod;
    LY_ERR rc = LY_SUCCESS;

    switch (pathtype) {
    case LYD_PATH_STD:
    case LYD_PATH_STD_NO_LAST_PRED:
        for (depth = 1; depth <= dnodes->count; ++depth) {
            /* current node */
            iter = dnodes->dnodes[depth - 1];
            mod = lyd_node_module(iter);

            /* parent */
            parent = (depth > 1) ? dnodes->dnodes[depth - 2] : NULL;
            assert(!parent || !iter->schema || !parent->schema || (parent->schema->nodetype & LYD_NODE_ANY) ||
                    (lysc_data_parent(iter->schema) == parent->schema) ||
                    (!lysc_data_parent(iter->schema) && (LYD_CTX(iter) != LYD_CTX(parent))) ||
                    (parent->schema->nodetype & (LYS_RPC | LYS_ACTION | LYS_NOTIF)));

            /* get module to print, if any */
            prev_mod = lyd_node_module(parent);
            if (prev_mod == mod) {
                mod = NULL;
            }

            /* realloc string */
            len = 1 + (mod ? strlen(mod->name) + 1 : 0) + (iter->schema ? strlen(iter->schema->name) :
                    strlen(((struct lyd_node_opaq *)iter)->name.name));
            if ((rc = lyd_path_str_enlarge(&buffer, &buflen, bufused + len, 0))) {
                break;
            }

            /* print next node */
            bufused += sprintf(buffer + bufused, "/%s%s%s", mod ? mod->name : "", mod ? ":" : "", LYD_NAME(iter));

            /* do not always print the last (first) predicate */
            if (iter->schema && ((depth > 1) || (pathtype == LYD_PATH_STD))) {
                switch (iter->schema->nodetype) {
                case LYS_LIST:
                    if (iter->schema->flags & LYS_KEYLESS) {
                        /* print its position */
                        rc = lyd_path_position_predicate(iter, &buffer, &buflen, &bufused, 0);
                    } else {
                        /* print all list keys in predicates */
                        rc = lyd_path_list_predicate(iter, &buffer, &buflen, &bufused, 0);
                    }
                    break;
                case LYS_LEAFLIST:
                    if (iter->schema->flags & LYS_CONFIG_W) {
                        /* print leaf-list value */
                        rc = lyd_path_leaflist_predicate(iter, &buffer, &buflen, &bufused, 0);
                    } else {
                        /* print its position */
                        rc = lyd_path_position_predicate(iter, &buffer, &buflen, &bufused, 0);
                    }
                    break;
                default:
                    /* nothing to print more */
                    break;
                }
            }
            if (rc) {
                break;
            }
        }
        break;
    }

    return buffer;
}